

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

void __thiscall ImgfsFile::nameinfo::nameinfo(nameinfo *this,uint8_t *p)

{
  ushort uVar1;
  uint32_t uVar2;
  basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
  local_58;
  string local_38;
  
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  uVar1 = *(ushort *)p;
  this->_length = uVar1;
  this->_flags = *(uint16_t *)(p + 2);
  if (uVar1 < 5) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::
    basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>::
    _M_construct<unsigned_short_const*>
              ((basic_string<unsigned_short,std::char_traits<unsigned_short>,std::allocator<unsigned_short>>
                *)&local_58,p + 4,p + 0xc);
    ToString<unsigned_short>(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)&this->_name,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::
    basic_string<unsigned_short,_std::char_traits<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~basic_string(&local_58);
    this->_hash = 0;
    uVar2 = 0;
  }
  else {
    this->_hash = *(uint32_t *)(p + 4);
    uVar2 = *(uint32_t *)(p + 8);
  }
  this->_ptr = uVar2;
  return;
}

Assistant:

nameinfo(const uint8_t *p)
        {
            _length= get16le(p);
            _flags= get16le(p+2);
            if (_length<=4) {
                _name= ToString(std::Wstring((const WCHAR*)(p+4), 4));
                _hash= 0;
                _ptr= 0;
            }
            else {
                _hash= get32le(p+4);
                _ptr= get32le(p+8);
            }
        }